

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall chrono::robosimian::RoboSimian::Create(RoboSimian *this,bool has_sled,bool fixed)

{
  undefined1 local_f4 [24];
  undefined1 local_dc [24];
  undefined1 local_c4 [40];
  float local_9c;
  value_type local_98;
  shared_ptr<chrono::robosimian::RS_Sled> local_88;
  shared_ptr<chrono::robosimian::RS_Chassis> local_78;
  shared_ptr<chrono::ChMaterialSurface> local_68;
  shared_ptr<chrono::ChMaterialSurface> local_58;
  shared_ptr<chrono::ChMaterialSurface> local_48;
  shared_ptr<chrono::ChMaterialSurface> local_38;
  shared_ptr<chrono::ChMaterialSurface> local_28;
  ChContactMethod local_18;
  undefined1 local_12 [2];
  ChContactMethod contact_method;
  bool fixed_local;
  bool has_sled_local;
  RoboSimian *this_local;
  
  local_12[0] = fixed;
  local_12[1] = has_sled;
  _contact_method = this;
  local_18 = (**(code **)(*(long *)this->m_system + 0x178))();
  if (local_18 == NSC) {
    chrono::collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.01);
    chrono::collision::ChCollisionModel::SetDefaultSuggestedMargin(0.005);
  }
  DefaultContactMaterial((robosimian *)&local_28,local_18);
  std::shared_ptr<chrono::ChMaterialSurface>::operator=(&this->m_chassis_material,&local_28);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_28);
  DefaultContactMaterial((robosimian *)&local_38,local_18);
  std::shared_ptr<chrono::ChMaterialSurface>::operator=(&this->m_sled_material,&local_38);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_38);
  DefaultContactMaterial((robosimian *)&local_48,local_18);
  std::shared_ptr<chrono::ChMaterialSurface>::operator=(&this->m_wheel_material,&local_48);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_48);
  DefaultContactMaterial((robosimian *)&local_58,local_18);
  std::shared_ptr<chrono::ChMaterialSurface>::operator=(&this->m_link_material,&local_58);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_58);
  DefaultContactMaterial((robosimian *)&local_68,local_18);
  std::shared_ptr<chrono::ChMaterialSurface>::operator=(&this->m_wheelDD_material,&local_68);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_68);
  chrono_types::
  make_shared<chrono::robosimian::RS_Chassis,_const_char_(&)[8],_bool_&,_std::shared_ptr<chrono::ChMaterialSurface>_&,_chrono::ChSystem_*&,_0>
            ((char (*) [8])&local_78,(bool *)0x2a378c,
             (shared_ptr<chrono::ChMaterialSurface> *)local_12,
             (ChSystem **)&this->m_chassis_material);
  std::shared_ptr<chrono::robosimian::RS_Chassis>::operator=(&this->m_chassis,&local_78);
  std::shared_ptr<chrono::robosimian::RS_Chassis>::~shared_ptr(&local_78);
  if ((local_12[1] & 1) != 0) {
    chrono_types::
    make_shared<chrono::robosimian::RS_Sled,_const_char_(&)[5],_std::shared_ptr<chrono::ChMaterialSurface>_&,_chrono::ChSystem_*&,_0>
              ((char (*) [5])&local_88,(shared_ptr<chrono::ChMaterialSurface> *)0x2a37ae,
               (ChSystem **)&this->m_sled_material);
    std::shared_ptr<chrono::robosimian::RS_Sled>::operator=(&this->m_sled,&local_88);
    std::shared_ptr<chrono::robosimian::RS_Sled>::~shared_ptr(&local_88);
  }
  local_9c = 0.0;
  chrono_types::
  make_shared<chrono::robosimian::RS_Limb,_const_char_(&)[6],_chrono::robosimian::LimbID,_const_chrono::robosimian::LinkData_(&)[11],_std::shared_ptr<chrono::ChMaterialSurface>_&,_std::shared_ptr<chrono::ChMaterialSurface>_&,_chrono::ChSystem_*&,_0>
            ((char (*) [6])&local_98,(LimbID *)"limb1",(LinkData (*) [11])&local_9c,
             (shared_ptr<chrono::ChMaterialSurface> *)front_links,&this->m_wheel_material,
             (ChSystem **)&this->m_link_material);
  std::
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
  ::push_back(&this->m_limbs,&local_98);
  std::shared_ptr<chrono::robosimian::RS_Limb>::~shared_ptr(&local_98);
  local_c4._0_4_ = 1;
  chrono_types::
  make_shared<chrono::robosimian::RS_Limb,_const_char_(&)[6],_chrono::robosimian::LimbID,_const_chrono::robosimian::LinkData_(&)[11],_std::shared_ptr<chrono::ChMaterialSurface>_&,_std::shared_ptr<chrono::ChMaterialSurface>_&,_chrono::ChSystem_*&,_0>
            ((char (*) [6])(local_c4 + 4),(LimbID *)"limb2",(LinkData (*) [11])local_c4,
             (shared_ptr<chrono::ChMaterialSurface> *)rear_links,&this->m_wheel_material,
             (ChSystem **)&this->m_link_material);
  std::
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
  ::push_back(&this->m_limbs,(value_type *)(local_c4 + 4));
  std::shared_ptr<chrono::robosimian::RS_Limb>::~shared_ptr
            ((shared_ptr<chrono::robosimian::RS_Limb> *)(local_c4 + 4));
  local_dc._0_4_ = 2;
  chrono_types::
  make_shared<chrono::robosimian::RS_Limb,_const_char_(&)[6],_chrono::robosimian::LimbID,_const_chrono::robosimian::LinkData_(&)[11],_std::shared_ptr<chrono::ChMaterialSurface>_&,_std::shared_ptr<chrono::ChMaterialSurface>_&,_chrono::ChSystem_*&,_0>
            ((char (*) [6])(local_dc + 4),(LimbID *)"limb3",(LinkData (*) [11])local_dc,
             (shared_ptr<chrono::ChMaterialSurface> *)rear_links,&this->m_wheel_material,
             (ChSystem **)&this->m_link_material);
  std::
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
  ::push_back(&this->m_limbs,(value_type *)(local_dc + 4));
  std::shared_ptr<chrono::robosimian::RS_Limb>::~shared_ptr
            ((shared_ptr<chrono::robosimian::RS_Limb> *)(local_dc + 4));
  local_f4._0_4_ = 3;
  chrono_types::
  make_shared<chrono::robosimian::RS_Limb,_const_char_(&)[6],_chrono::robosimian::LimbID,_const_chrono::robosimian::LinkData_(&)[11],_std::shared_ptr<chrono::ChMaterialSurface>_&,_std::shared_ptr<chrono::ChMaterialSurface>_&,_chrono::ChSystem_*&,_0>
            ((char (*) [6])(local_f4 + 4),(LimbID *)"limb4",(LinkData (*) [11])local_f4,
             (shared_ptr<chrono::ChMaterialSurface> *)front_links,&this->m_wheel_material,
             (ChSystem **)&this->m_link_material);
  std::
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
  ::push_back(&this->m_limbs,(value_type *)(local_f4 + 4));
  std::shared_ptr<chrono::robosimian::RS_Limb>::~shared_ptr
            ((shared_ptr<chrono::robosimian::RS_Limb> *)(local_f4 + 4));
  SetVisualizationTypeChassis(this,COLLISION);
  SetVisualizationTypeSled(this,COLLISION);
  SetVisualizationTypeLimbs(this,COLLISION);
  SetVisualizationTypeWheels(this,COLLISION);
  return;
}

Assistant:

void RoboSimian::Create(bool has_sled, bool fixed) {
    auto contact_method = m_system->GetContactMethod();

    // Set default collision model envelope commensurate with model dimensions.
    // Note that an SMC system automatically sets envelope to 0.
    if (contact_method == ChContactMethod::NSC) {
        collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.01);
        collision::ChCollisionModel::SetDefaultSuggestedMargin(0.005);
    }

    // Create the contact materials (all with default properties)
    m_chassis_material = DefaultContactMaterial(contact_method);
    m_sled_material = DefaultContactMaterial(contact_method);
    m_wheel_material = DefaultContactMaterial(contact_method);
    m_link_material = DefaultContactMaterial(contact_method);
    m_wheelDD_material = DefaultContactMaterial(contact_method);

    m_chassis = chrono_types::make_shared<RS_Chassis>("chassis", fixed, m_chassis_material, m_system);

    if (has_sled)
        m_sled = chrono_types::make_shared<RS_Sled>("sled", m_sled_material, m_system);

    m_limbs.push_back(
        chrono_types::make_shared<RS_Limb>("limb1", FR, front_links, m_wheel_material, m_link_material, m_system));
    m_limbs.push_back(
        chrono_types::make_shared<RS_Limb>("limb2", RR, rear_links, m_wheel_material, m_link_material, m_system));
    m_limbs.push_back(
        chrono_types::make_shared<RS_Limb>("limb3", RL, rear_links, m_wheel_material, m_link_material, m_system));
    m_limbs.push_back(
        chrono_types::make_shared<RS_Limb>("limb4", FL, front_links, m_wheel_material, m_link_material, m_system));

    // The differential-drive wheels will be removed from robosimian
    ////m_wheel_left = chrono_types::make_shared<RS_WheelDD>("dd_wheel_left", 2, m_wheelDD_material, m_system);
    ////m_wheel_right = chrono_types::make_shared<RS_WheelDD>("dd_wheel_right", 3, m_wheelDD_material, m_system);

    // Default visualization: COLLISION shapes
    SetVisualizationTypeChassis(VisualizationType::COLLISION);
    SetVisualizationTypeSled(VisualizationType::COLLISION);
    SetVisualizationTypeLimbs(VisualizationType::COLLISION);
    SetVisualizationTypeWheels(VisualizationType::COLLISION);
}